

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qthread.cpp
# Opt level: O0

void QThread::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QThread *in_RDI;
  QThread *unaff_retaddr;
  QThread *_t;
  Priority priority;
  
  if (in_ESI == 0) {
    priority = (Priority)((ulong)in_RDI >> 0x20);
    switch(in_EDX) {
    case 0:
      started(in_RDI);
      break;
    case 1:
      finished(in_RDI);
      break;
    case 2:
      start(unaff_retaddr,priority);
      break;
    case 3:
      start(unaff_retaddr,priority);
      break;
    case 4:
      terminate(in_RDI);
      break;
    case 5:
      exit(in_RDI,**(int **)(in_RCX + 8));
      break;
    case 6:
      exit(in_RDI,0);
      break;
    case 7:
      quit((QThread *)0x5582a3);
    }
  }
  if ((in_ESI == 5) &&
     (bVar1 = QtMocHelpers::indexOfMethod<void(QThread::*)(QThread::QPrivateSignal)>
                        (in_RCX,(void **)started,0,0), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QThread::*)(QThread::QPrivateSignal)>
              (in_RCX,(void **)finished,0,1);
  }
  return;
}

Assistant:

void QThread::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QThread *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(QPrivateSignal()); break;
        case 1: _t->finished(QPrivateSignal()); break;
        case 2: _t->start((*reinterpret_cast< std::add_pointer_t<Priority>>(_a[1]))); break;
        case 3: _t->start(); break;
        case 4: _t->terminate(); break;
        case 5: _t->exit((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->exit(); break;
        case 7: _t->quit(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QThread::*)(QPrivateSignal)>(_a, &QThread::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QThread::*)(QPrivateSignal)>(_a, &QThread::finished, 1))
            return;
    }
}